

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BLBackTrace.cpp
# Opt level: O1

void __thiscall amrex::BLBTer::~BLBTer(BLBTer *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pop_bt_stack(this);
  pcVar1 = (this->line_file)._M_dataplus._M_p;
  paVar2 = &(this->line_file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

BLBTer::~BLBTer()
{
#ifdef AMREX_USE_OMP
    if (omp_in_parallel()) {
        pop_bt_stack();
    }
    else {
        #pragma omp parallel
        {
            pop_bt_stack();
        }
    }
#else
    pop_bt_stack();
#endif
}